

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

TestCaseGroup * vkt::sr::createBuiltinVarTests(TestContext *testCtx)

{
  undefined4 uVar1;
  char *__s;
  TestNode *pTVar2;
  TestNode *pTVar3;
  uint uVar4;
  char *__end;
  long lVar5;
  char *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined2 uStack_82;
  undefined8 uStack_80;
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  TestContext *local_58;
  allocator<char> local_4a;
  allocator<char> local_49;
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  local_48 = (TestNode *)operator_new(0x70);
  local_58 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_48,testCtx,"builtin_var","Shader builtin variable tests.");
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,local_58,"simple","Simple cases.");
  local_40 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_40,local_58,"input_variations","Input type variation tests.");
  local_38 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_38,local_58,"frontfacing","Test gl_Frontfacing keyword.");
  pTVar3 = (TestNode *)operator_new(0x70);
  local_98 = (char *)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"fragcoord_xyz","");
  local_78 = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"FragCoord xyz test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,local_98,local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf5f98;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  if (local_78 != (char *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_98 != (char *)&local_88) {
    operator_delete(local_98,CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88))) +
                             1);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  local_98 = (char *)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"fragcoord_w","");
  local_78 = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"FragCoord w test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,local_98,local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf6058;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  if (local_78 != (char *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_98 != (char *)&local_88) {
    operator_delete(local_98,CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88))) +
                             1);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  local_98 = (char *)&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"pointcoord","");
  local_78 = (char *)&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"PointCoord test","");
  tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,local_98,local_78);
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf6118;
  tcu::TestNode::addChild(pTVar2,pTVar3);
  if (local_78 != (char *)&local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_98 != (char *)&local_88) {
    operator_delete(local_98,CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88))) +
                             1);
  }
  lVar5 = 0;
  do {
    pTVar3 = (TestNode *)operator_new(0x78);
    uVar1 = *(undefined4 *)((long)&createBuiltinVarTests::frontfacingCases[0].primitive + lVar5);
    __s = *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].desc + lVar5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               *(char **)((long)&createBuiltinVarTests::frontfacingCases[0].name + lVar5),&local_49)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_4a);
    tcu::TestCase::TestCase((TestCase *)pTVar3,local_58,local_98,local_78);
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cec1f0;
    if (local_78 != (char *)&local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != (char *)&local_88) {
      operator_delete(local_98,CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88)))
                               + 1);
    }
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf61d8;
    *(undefined4 *)&pTVar3[1]._vptr_TestNode = uVar1;
    tcu::TestNode::addChild(local_38,pTVar3);
    pTVar3 = local_48;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x78);
  tcu::TestNode::addChild(local_48,local_38);
  uVar4 = 0;
  tcu::TestNode::addChild(pTVar3,pTVar2);
  do {
    pTVar2 = (TestNode *)operator_new(0x78);
    local_98 = (char *)&local_88;
    uStack_84 = 0x74;
    local_88 = 0x75706e69;
    local_90 = 5;
    uStack_83 = 0;
    if (uVar4 == 0) {
      local_78 = (char *)&local_68;
      local_68 = 0x6f6e5f7475706e69;
      local_70 = 10;
      uStack_60 = CONCAT53(uStack_60._3_5_,0x656e);
    }
    else {
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::append((char *)&local_98);
      }
      if ((uVar4 & 2) != 0) {
        std::__cxx11::string::append((char *)&local_98);
      }
      if (3 < uVar4) {
        std::__cxx11::string::append((char *)&local_98);
      }
      local_78 = (char *)&local_68;
      if (local_98 == (char *)&local_88) {
        uStack_60 = uStack_80;
      }
      else {
        local_78 = local_98;
      }
      local_68 = CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88)));
      local_70 = local_90;
    }
    local_98 = (char *)&local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Input variation test","");
    tcu::TestCase::TestCase((TestCase *)pTVar2,local_58,local_78,local_98);
    pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf62f8;
    *(short *)&pTVar2[1]._vptr_TestNode = (short)uVar4;
    tcu::TestNode::addChild(local_40,pTVar2);
    if (local_98 != (char *)&local_88) {
      operator_delete(local_98,CONCAT26(uStack_82,CONCAT15(uStack_83,CONCAT14(uStack_84,local_88)))
                               + 1);
    }
    if (local_78 != (char *)&local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    pTVar2 = local_48;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  tcu::TestNode::addChild(local_48,local_40);
  return (TestCaseGroup *)pTVar2;
}

Assistant:

TestCaseGroup* createBuiltinVarTests (TestContext& testCtx)
{
	de::MovePtr<TestCaseGroup> builtinGroup			(new TestCaseGroup(testCtx, "builtin_var", "Shader builtin variable tests."));
	de::MovePtr<TestCaseGroup> simpleGroup			(new TestCaseGroup(testCtx, "simple", "Simple cases."));
	de::MovePtr<TestCaseGroup> inputVariationsGroup	(new TestCaseGroup(testCtx, "input_variations", "Input type variation tests."));
	de::MovePtr<TestCaseGroup> frontFacingGroup		(new TestCaseGroup(testCtx, "frontfacing", "Test gl_Frontfacing keyword."));

	simpleGroup->addChild(new BuiltinGlFragCoordXYZCase(testCtx, "fragcoord_xyz", "FragCoord xyz test"));
	simpleGroup->addChild(new BuiltinGlFragCoordWCase(testCtx, "fragcoord_w", "FragCoord w test"));
	simpleGroup->addChild(new BuiltinGlPointCoordCase(testCtx, "pointcoord", "PointCoord test"));

	// gl_FrontFacing tests
	{
		static const struct PrimitiveTable
		{
			const char*				name;
			const char*				desc;
			VkPrimitiveTopology		primitive;
		} frontfacingCases[] =
		{
			{ "point_list",		"Test that points are frontfacing",							VK_PRIMITIVE_TOPOLOGY_POINT_LIST },
			{ "line_list",		"Test that lines are frontfacing",							VK_PRIMITIVE_TOPOLOGY_LINE_LIST },
			{ "triangle_list",	"Test that triangles can be frontfacing or backfacing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST },
			{ "triangle_strip",	"Test that traiangle strips can be front or back facing",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP },
			{ "triangle_fan",	"Test that triangle fans can be front or back facing",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN },
		};

		for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(frontfacingCases); ndx++)
			frontFacingGroup->addChild(new BuiltinGlFrontFacingCase(testCtx, frontfacingCases[ndx].primitive, frontfacingCases[ndx].name, frontfacingCases[ndx].desc));
	}

	builtinGroup->addChild(frontFacingGroup.release());
	builtinGroup->addChild(simpleGroup.release());

	for (deUint16 shaderType = 0; shaderType <= (SHADER_INPUT_BUILTIN_BIT | SHADER_INPUT_VARYING_BIT | SHADER_INPUT_CONSTANT_BIT); ++shaderType)
	{
		inputVariationsGroup->addChild(new BuiltinInputVariationsCase(testCtx, shaderInputTypeToString(shaderType), "Input variation test", shaderType));
	}

	builtinGroup->addChild(inputVariationsGroup.release());
	return builtinGroup.release();
}